

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error
adios2_get(adios2_engine *engine,adios2_variable *variable,void *values,adios2_mode mode)

{
  signed *psVar1;
  char *pcVar2;
  uchar *puVar3;
  complex *pcVar4;
  double *pdVar5;
  int *piVar6;
  long *plVar7;
  ulong *puVar8;
  short *psVar9;
  ushort *puVar10;
  string *psVar11;
  uint *puVar12;
  longdouble *plVar13;
  float *pfVar14;
  Mode MVar15;
  allocator local_89;
  string dataStr;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_48,"for adios2_engine, in call to adios2_get",(allocator *)&dataStr);
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string
            ((string *)&local_68,"for adios2_variable, in call to adios2_get",(allocator *)&dataStr)
  ;
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  MVar15 = (Mode)values;
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    psVar1 = (signed *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<signed_char>::typeinfo,0);
    adios2::core::Engine::Get<signed_char>((Variable *)engine,psVar1,MVar15);
    break;
  case 2:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    psVar9 = (short *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<short>::typeinfo,0);
    adios2::core::Engine::Get<short>((Variable *)engine,psVar9,MVar15);
    break;
  case 3:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    piVar6 = (int *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<int>::typeinfo,0);
    adios2::core::Engine::Get<int>((Variable *)engine,piVar6,MVar15);
    break;
  case 4:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    plVar7 = (long *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<long>::typeinfo,0);
    adios2::core::Engine::Get<long>((Variable *)engine,plVar7,MVar15);
    break;
  case 5:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    puVar3 = (uchar *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_char>((Variable *)engine,puVar3,MVar15);
    break;
  case 6:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    puVar10 = (ushort *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_short>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_short>((Variable *)engine,puVar10,MVar15);
    break;
  case 7:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    puVar12 = (uint *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_int>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_int>((Variable *)engine,puVar12,MVar15);
    break;
  case 8:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    puVar8 = (ulong *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_long>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_long>((Variable *)engine,puVar8,MVar15);
    break;
  case 9:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    pfVar14 = (float *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                      &adios2::core::Variable<float>::typeinfo,0);
    adios2::core::Engine::Get<float>((Variable *)engine,pfVar14,MVar15);
    break;
  case 10:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    pdVar5 = (double *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<double>::typeinfo,0);
    adios2::core::Engine::Get<double>((Variable *)engine,pdVar5,MVar15);
    break;
  case 0xb:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    plVar13 = (longdouble *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<long_double>::typeinfo,0);
    adios2::core::Engine::Get<long_double>((Variable *)engine,plVar13,MVar15);
    break;
  case 0xc:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    pcVar4 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    adios2::core::Engine::Get<std::complex<float>>((Variable *)engine,pcVar4,MVar15);
    break;
  case 0xd:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    pcVar4 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    adios2::core::Engine::Get<std::complex<double>>((Variable *)engine,pcVar4,MVar15);
    break;
  case 0xe:
    dataStr._M_dataplus._M_p = (pointer)&dataStr.field_2;
    dataStr._M_string_length = 0;
    dataStr.field_2._M_local_buf[0] = '\0';
    psVar11 = (string *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    adios2::core::Engine::Get<std::__cxx11::string>((Variable *)engine,psVar11,(Mode)&dataStr);
    std::__cxx11::string::copy((char *)&dataStr,(ulong)values,dataStr._M_string_length);
    std::__cxx11::string::~string((string *)&dataStr);
    break;
  case 0xf:
    std::__cxx11::string::string
              ((string *)&dataStr,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
               &local_89);
    anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
    std::__cxx11::string::~string((string *)&dataStr);
    pcVar2 = (char *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<char>::typeinfo,0);
    adios2::core::Engine::Get<char>((Variable *)engine,pcVar2,MVar15);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get(adios2_engine *engine, adios2_variable *variable, void *values,
                        const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_get");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_get");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::DataType type(variableBase->m_Type);

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            std::string dataStr;
            engineCpp->Get(*dynamic_cast<adios2::core::Variable<std::string> *>(variableBase),
                           dataStr);
            dataStr.copy(reinterpret_cast<char *>(values), dataStr.size());
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const adios2::Mode modeCpp =                                                               \
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "        \
                                "in call to adios2_get");                                          \
        engineCpp->Get(*dynamic_cast<adios2::core::Variable<T> *>(variableBase),                   \
                       reinterpret_cast<T *>(values), modeCpp);                                    \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get"));
    }
}